

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

ND_UINT8 ShemuX86CountZeroBits(ND_UINT64 Value,ND_OPERAND_SIZE Size,ND_BOOL Forward)

{
  bool bVar1;
  undefined4 local_20;
  undefined4 local_1c;
  ND_SINT32 i_1;
  ND_UINT32 i;
  ND_UINT8 cnt;
  ND_BOOL Forward_local;
  ND_OPERAND_SIZE Size_local;
  ND_UINT64 Value_local;
  
  i_1._2_1_ = '\0';
  if (Forward == '\0') {
    local_20 = Size * 8;
    while( true ) {
      local_20 = local_20 + -1;
      bVar1 = false;
      if (-1 < local_20) {
        bVar1 = (Value >> ((byte)local_20 & 0x3f) & 1) == 0;
      }
      if (!bVar1) break;
      i_1._2_1_ = i_1._2_1_ + '\x01';
    }
  }
  else {
    local_1c = 0;
    while( true ) {
      bVar1 = false;
      if (local_1c < Size << 3) {
        bVar1 = (Value >> ((byte)local_1c & 0x3f) & 1) == 0;
      }
      if (!bVar1) break;
      local_1c = local_1c + 1;
      i_1._2_1_ = i_1._2_1_ + '\x01';
    }
  }
  return i_1._2_1_;
}

Assistant:

static ND_UINT8
ShemuX86CountZeroBits(
    ND_UINT64 Value,
    ND_OPERAND_SIZE Size,
    ND_BOOL Forward
    )
{
    ND_UINT8 cnt = 0;

    if (Forward)
    {
        for (ND_UINT32 i = 0; i < Size * 8 && ND_GET_BIT(i, Value) == 0; i++, cnt++);
    }
    else
    {
        for (ND_SINT32 i = Size * 8 - 1; i >= 0 && ND_GET_BIT(i, Value) == 0; i--, cnt++);
    }

    return cnt;
}